

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

void ImGui_ImplGlfw_CursorPosCallback(GLFWwindow *window,double x,double y)

{
  int iVar1;
  ImGui_ImplGlfw_Data *pIVar2;
  ImGuiIO *this;
  
  pIVar2 = ImGui_ImplGlfw_GetBackendData();
  if ((pIVar2->PrevUserCallbackCursorPos != (GLFWcursorposfun)0x0) && (pIVar2->Window == window)) {
    (*pIVar2->PrevUserCallbackCursorPos)(window,x,y);
  }
  iVar1 = glfwGetInputMode(window,0x33001);
  if (iVar1 != 0x34003) {
    this = ImGui::GetIO();
    ImGuiIO::AddMousePosEvent(this,(float)x,(float)y);
    (pIVar2->LastValidMousePos).x = (float)x;
    (pIVar2->LastValidMousePos).y = (float)y;
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_CursorPosCallback(GLFWwindow* window, double x, double y)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    if (bd->PrevUserCallbackCursorPos != nullptr && window == bd->Window)
        bd->PrevUserCallbackCursorPos(window, x, y);
    if (glfwGetInputMode(window, GLFW_CURSOR) == GLFW_CURSOR_DISABLED)
        return;

    ImGuiIO& io = ImGui::GetIO();
    io.AddMousePosEvent((float)x, (float)y);
    bd->LastValidMousePos = ImVec2((float)x, (float)y);
}